

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O3

void __thiscall cs::token_signal::token_signal(token_signal *this,signal_types t)

{
  compile_error *this_00;
  string local_38;
  
  (this->super_token_base).line_num = 1;
  (this->super_token_base)._vptr_token_base = (_func_int **)&PTR__token_base_0025bf20;
  this->mType = t;
  if (t != error_) {
    return;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Unknown signal.","");
  compile_error::compile_error(this_00,&local_38);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

token_base(const token_base &) = default;